

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
poly::vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy>::
push_back_new_elem_w_storage_increase<Impl1,Impl1>
          (vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy> *this,
          Impl1 *param_2)

{
  long lVar1;
  void_pointer pvVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  long v_2;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  long v_1;
  ulong uVar10;
  _Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
  _Var11;
  long lVar12;
  ulong max_align;
  ulong uVar13;
  Impl1 *this_00;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> v;
  allocator_base<std::allocator<unsigned_char>_> local_68;
  vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
  *local_58;
  vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
  *pvStack_50;
  ulong local_48;
  poly_copy_descr local_38;
  
  lVar5 = *(long *)this;
  lVar1 = *(long *)(this + 0x10);
  uVar13 = (ulong)(*(long *)(this + 0x18) - lVar5) >> 4 & 0xfffffffffffffffe;
  uVar13 = uVar13 + (uVar13 == 0);
  max_align = 8;
  if (8 < *(ulong *)(this + 0x20)) {
    max_align = *(ulong *)(this + 0x20);
  }
  uVar10 = max_align;
  if (lVar5 != lVar1) {
    lVar12 = lVar5;
    do {
      uVar6 = *(long *)(lVar12 + 0x10) + (max_align - 1);
      uVar10 = (uVar10 - uVar6 % max_align) + uVar6;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != lVar1);
  }
  uVar7 = (max_align - (max_align + 0x2f) % max_align) + 0x2f;
  uVar6 = uVar7;
  if (lVar5 != lVar1) {
    lVar12 = lVar1 - lVar5 >> 5;
    uVar6 = (lVar12 + uVar10 + uVar7) / (lVar12 + 1U);
  }
  uVar8 = lVar1 - lVar5 >> 5;
  lVar5 = 0;
  if (uVar8 <= uVar13) {
    lVar5 = uVar13 - uVar8;
  }
  local_58 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
              *)0x0;
  pvStack_50 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                *)0x0;
  local_68._storage =
       (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
        *)0x0;
  local_68._end_storage = (void_pointer)0x0;
  local_48 = 8;
  vector_impl::allocator_base<std::allocator<unsigned_char>_>::allocate
            (&local_68,uVar7 + uVar13 * 0x20 + uVar10 + lVar5 * uVar6);
  local_58 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
              *)local_68._storage;
  pvStack_50 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                *)((long)local_68._storage + uVar13 * 0x20);
  local_48 = max_align;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::
  poly_uninitialized_copy
            (&local_38,&local_68,local_68._storage,*(elem_ptr_const_pointer *)this,
             *(elem_ptr_const_pointer *)(this + 0x10),*(elem_ptr_const_pointer *)this + uVar13,
             max_align);
  local_58 = local_38.
             super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
             .
             super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
             ._M_head_impl;
  pvStack_50 = local_38.
               super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
               .
               super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
               .
               super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
               ._M_head_impl;
  if ((local_38.
       super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl !=
       local_38.
       super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl) && (7 < local_48)) {
    _Var11._M_head_impl =
         local_38.
         super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
         .
         super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
         .
         super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
         ._M_head_impl;
    if (local_38.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
        ._M_head_impl !=
        (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
         *)local_68._storage) {
      _Var11._M_head_impl =
           (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
            *)((long)local_38.
                     super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                     .
                     super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
                     ._M_head_impl[-1].ptr.first +
              local_38.
              super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
              .
              super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
              ._M_head_impl[-1].sf.first);
    }
    if ((void_pointer)
        ((long)_Var11._M_head_impl +
        (local_48 - ((long)_Var11._M_head_impl + (local_48 - 1)) % local_48) + 0x2f) <=
        local_68._end_storage) {
      if (local_38.
          super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
          .
          super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
          ._M_head_impl !=
          (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
           *)local_68._storage) {
        local_38.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
        .
        super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
        .
        super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
        ._M_head_impl =
             (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
              *)((long)local_38.
                       super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                       .
                       super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
                       ._M_head_impl[-1].ptr.first +
                local_38.
                super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                .
                super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
                ._M_head_impl[-1].sf.first);
      }
      this_00 = (Impl1 *)(((local_48 - 1) -
                          ((local_48 - 1) +
                          (long)local_38.
                                super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                                .
                                super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                                .
                                super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
                                ._M_head_impl) % local_48) +
                         (long)local_38.
                               super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                               .
                               super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                               .
                               super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
                               ._M_head_impl);
      Impl1::Impl1(this_00,param_2);
      (local_58->ptr).first = this_00;
      (local_58->ptr).second = (Interface *)this_00;
      (local_58->sf).first = 0x30;
      (local_58->sf).second = 8;
      puVar9 = *(undefined8 **)this;
      *(void_pointer *)this = local_68._storage;
      pvVar2 = *(void_pointer *)(this + 8);
      *(void_pointer *)(this + 8) = local_68._end_storage;
      puVar3 = *(undefined8 **)(this + 0x10);
      *(vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
        **)(this + 0x10) = local_58 + 1;
      lVar5 = *(long *)(this + 0x18);
      *(vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
        **)(this + 0x18) = pvStack_50;
      uVar4 = *(undefined8 *)(this + 0x20);
      *(ulong *)(this + 0x20) = local_48;
      local_68._storage = puVar9;
      local_68._end_storage = pvVar2;
      local_58 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                  *)puVar3;
      pvStack_50 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                    *)lVar5;
      local_48 = uVar4;
      for (; puVar3 != puVar9; puVar9 = puVar9 + 4) {
        (**(code **)(*(long *)puVar9[1] + 0x18))();
        puVar9[2] = 0;
        puVar9[3] = 0;
        *puVar9 = 0;
        puVar9[1] = 0;
      }
      local_48 = 8;
      puVar9 = (undefined8 *)local_68._storage;
      if (0x1f < (ulong)((long)pvStack_50 - (long)local_68._storage)) {
        do {
          puVar9[2] = 0;
          puVar9[3] = 0;
          *puVar9 = 0;
          puVar9[1] = 0;
          puVar9 = puVar9 + 4;
        } while (puVar9 != (undefined8 *)
                           (((long)pvStack_50 - (long)local_68._storage & 0xffffffffffffffe0U) +
                           (long)local_68._storage));
      }
      local_58 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                  *)0x0;
      pvStack_50 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                    *)0x0;
      operator_delete(local_68._storage,(long)local_68._end_storage - (long)local_68._storage);
      local_68._storage = (void_pointer)0x0;
      local_68._end_storage = (void_pointer)0x0;
      operator_delete((void *)0x0,0);
      return;
    }
  }
  __assert_fail("can_construct_new_elem(s, a)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                ,0x5a9,
                "void poly::vector<Interface, std::allocator<Interface>, poly::virtual_cloning_policy>::push_back_new_elem(type_tag<T>, Args &&...) [IF = Interface, Allocator = std::allocator<Interface>, CloningPolicy = poly::virtual_cloning_policy, T = Impl1, Args = <Impl1>]"
               );
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem_w_storage_increase(
    type_tag<T> /* t */, Args&&... args)
{
    constexpr auto s                = sizeof(T);
    constexpr auto a                = alignof(T);
    constexpr auto noexcept_movable = interface_type_noexcept_movable::value;
    constexpr auto nothrow_ctor     = std::is_nothrow_constructible<T, Args...>::value;
    //////////////////////////////////////////
    const auto new_capacity = std::max(capacity() * 2, size_t(1));
    const auto sizes        = calculate_storage_size(new_capacity, s, a);
    vector v(allocator_traits::select_on_container_copy_construction(base().get_allocator_ref()));
    v.init_layout(sizes.first, new_capacity, sizes.second);
    push_back_new_elem_w_storage_increase_copy(
        v, std::integral_constant < bool, noexcept_movable&& nothrow_ctor > {});
    v.push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    this->swap(v);
}